

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O0

void nn_streamhdr_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int protocol;
  nn_iovec iovec;
  nn_streamhdr *streamhdr;
  nn_fsm_event *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  nn_iovec *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  long local_40;
  
  local_40 = in_RDI;
  if (in_RDI == 0) {
    local_40 = 0;
  }
  switch(*(undefined4 *)(local_40 + 0x58)) {
  case 1:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_40 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
              ,0xa9);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_40 + 0x58),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
              ,0xa5);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_timer_start((nn_timer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    nn_usock_send((nn_usock *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    *(undefined4 *)(local_40 + 0x58) = 2;
    break;
  case 2:
    if (in_ESI == 1) {
      if (in_EDX == 3) {
        nn_usock_recv((nn_usock *)0x100000003,
                      (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (int *)in_stack_ffffffffffffff98);
        *(undefined4 *)(local_40 + 0x58) = 3;
      }
      else if (in_EDX == 5) {
        nn_timer_stop((nn_timer *)0x1535dc);
        *(undefined4 *)(local_40 + 0x58) = 4;
      }
      else if (in_EDX != 8) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_40 + 0x58),1,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0xc1);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (in_ESI != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_40 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0xcf);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_40 + 0x58),2,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0xcb);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop((nn_timer *)0x153665);
      *(undefined4 *)(local_40 + 0x58) = 4;
    }
    break;
  case 3:
    if (in_ESI == 1) {
      if (in_EDX == 4) {
        if (*(int *)(local_40 + 0x168) == 0x505300) {
          nn_gets((uint8_t *)(local_40 + 0x16c));
          iVar1 = nn_pipebase_ispeer((nn_pipebase *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
          if (iVar1 != 0) {
            nn_timer_stop((nn_timer *)0x1537e6);
            *(undefined4 *)(local_40 + 0x58) = 5;
            return;
          }
        }
      }
      else if (in_EDX != 5) {
        if (in_EDX == 8) {
          return;
        }
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0xef);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop((nn_timer *)0x15380c);
      *(undefined4 *)(local_40 + 0x58) = 4;
    }
    else {
      if (in_ESI != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_40 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0xfd);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_40 + 0x58),2,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0xf9);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop((nn_timer *)0x15387d);
      *(undefined4 *)(local_40 + 0x58) = 4;
    }
    break;
  case 4:
    if (in_ESI != 1) {
      if (in_ESI != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_40 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0x11b);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_40 + 0x58),2,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0x117);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_swap_owner((nn_usock *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (nn_fsm_owner *)in_stack_ffffffffffffff88);
      *(undefined8 *)(local_40 + 0x148) = 0;
      *(undefined4 *)(local_40 + 0x150) = 0xffffffff;
      *(undefined8 *)(local_40 + 0x158) = 0;
      *(undefined4 *)(local_40 + 0x58) = 6;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,0);
    }
    break;
  case 5:
    if (in_ESI != 1) {
      if (in_ESI != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_40 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0x138);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_40 + 0x58),2,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
                ,0x134);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_swap_owner((nn_usock *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (nn_fsm_owner *)in_stack_ffffffffffffff88);
      *(undefined8 *)(local_40 + 0x148) = 0;
      *(undefined4 *)(local_40 + 0x150) = 0xffffffff;
      *(undefined8 *)(local_40 + 0x158) = 0;
      *(undefined4 *)(local_40 + 0x58) = 6;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,0);
    }
    break;
  case 6:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)*(uint *)(local_40 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
            ,0x141);
    fflush(_stderr);
    nn_err_abort();
  default:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)(local_40 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
            ,0x147);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_streamhdr_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_streamhdr *streamhdr;
    struct nn_iovec iovec;
    int protocol;

    streamhdr = nn_cont (self, struct nn_streamhdr, fsm);


    switch (streamhdr->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_timer_start (&streamhdr->timer, 1000);
                iovec.iov_base = streamhdr->protohdr;
                iovec.iov_len = sizeof (streamhdr->protohdr);
                nn_usock_send (streamhdr->usock, &iovec, 1);
                streamhdr->state = NN_STREAMHDR_STATE_SENDING;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  SENDING state.                                                            */
/******************************************************************************/
    case NN_STREAMHDR_STATE_SENDING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                nn_usock_recv (streamhdr->usock, streamhdr->protohdr,
                    sizeof (streamhdr->protohdr), NULL);
                streamhdr->state = NN_STREAMHDR_STATE_RECEIVING;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  RECEIVING state.                                                          */
/******************************************************************************/
    case NN_STREAMHDR_STATE_RECEIVING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:

                /*  Here we are checking whether the peer speaks the same
                    protocol as this socket. */
                if (memcmp (streamhdr->protohdr, "\0SP\0", 4) != 0)
                    goto invalidhdr;
                protocol = nn_gets (streamhdr->protohdr + 4);
                if (!nn_pipebase_ispeer (streamhdr->pipebase, protocol))
                    goto invalidhdr;
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
invalidhdr:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_assert (0);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping, but there
                is only a subset of events that are plausible. */
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_ERROR);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping. */
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_OK);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_STREAMHDR_STATE_DONE:
        nn_fsm_bad_source (streamhdr->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (streamhdr->state, src, type);
    }
}